

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_ObjSetAttrs(Cba_Ntk_t *p,int i,int *a,int s)

{
  int iVar1;
  int s_local;
  int *a_local;
  int i_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_ObjAttr(p,i);
  if (iVar1 != 0) {
    __assert_fail("Cba_ObjAttr(p, i) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0xfa,"void Cba_ObjSetAttrs(Cba_Ntk_t *, int, int *, int)");
  }
  if (a != (int *)0x0) {
    iVar1 = Vec_IntSize(&p->vAttrSto);
    Vec_IntSetEntry(&p->vObjAttr,i,iVar1);
    Vec_IntPush(&p->vAttrSto,s);
    Vec_IntPushArray(&p->vAttrSto,a,s);
  }
  return;
}

Assistant:

static inline void           Cba_ObjSetAttrs( Cba_Ntk_t * p, int i, int * a, int s )  { assert(Cba_ObjAttr(p, i) == 0); if ( !a ) return; Vec_IntSetEntry(&p->vObjAttr, i, Vec_IntSize(&p->vAttrSto)); Vec_IntPush(&p->vAttrSto, s); Vec_IntPushArray(&p->vAttrSto, a, s);  }